

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O1

unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> __thiscall
Diligent::ShaderCodeBufferDescX::
PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
          (ShaderCodeBufferDescX *this,
          __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
          RangeStart,
          __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
          RangeEnd,IMemoryAllocator *RawAllocator)

{
  char *pcVar1;
  ShaderCodeVariableDesc *__s;
  ShaderCodeVariableDesc *pSVar2;
  IMemoryAllocator *Args_1;
  _Head_base<0UL,_void_*,_false> extraout_RDX;
  size_t size;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  _Var3;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> uVar4;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *DataBuffer;
  string msg;
  FixedLinearAllocator Allocator;
  string local_a8;
  FixedLinearAllocator local_88;
  
  local_88.m_ReservedSize = 0;
  local_88.m_CurrAlignment = 0;
  local_88.m_pDataStart = (uint8_t *)0x0;
  local_88.m_pCurrPtr = (uint8_t *)0x0;
  local_88.m_DbgCurrAllocation = 0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_DbgUsingExternalMemory = false;
  size = ((ulong)((long)RangeEnd._M_current - (long)RangeStart._M_current) >> 3) *
         -0x3333333333333330;
  Args_1 = RawAllocator;
  local_88.m_pAllocator = RawAllocator;
  FixedLinearAllocator::AddSpace(&local_88,size,8);
  if (RangeEnd._M_current != RangeStart._M_current) {
    _Var3._M_current = RangeStart._M_current;
    do {
      ShaderCodeVariableDescX::ReserveSpaceForMembers(&local_88,&(_Var3._M_current)->Variables);
      _Var3._M_current = _Var3._M_current + 1;
    } while (_Var3._M_current != RangeEnd._M_current);
  }
  FixedLinearAllocator::Reserve(&local_88);
  local_88.m_pAllocator = (IMemoryAllocator *)0x0;
  *(IMemoryAllocator **)&this->super_ShaderCodeBufferDesc = RawAllocator;
  (this->super_ShaderCodeBufferDesc).pVariables = (ShaderCodeVariableDesc *)local_88.m_pDataStart;
  __s = (ShaderCodeVariableDesc *)FixedLinearAllocator::Allocate(&local_88,size,8);
  if (RangeEnd._M_current != RangeStart._M_current) {
    memset(__s,0,size);
  }
  if (__s != (this->super_ShaderCodeBufferDesc).pVariables) {
    FormatString<char[26],char[26]>
              (&local_a8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pRefl == DataBuffer.get()",(char (*) [26])Args_1);
    DebugAssertionFailed
              (local_a8._M_dataplus._M_p,"PackArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/ShaderToolsCommon.hpp"
               ,0x172);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  if (RangeStart._M_current != RangeEnd._M_current) {
    do {
      pcVar1 = *(char **)&(RangeStart._M_current)->super_ShaderCodeBufferDesc;
      pSVar2 = ShaderCodeVariableDescX::CopyMembers(&local_88,&(RangeStart._M_current)->Variables);
      __s->Name = pcVar1;
      __s->TypeName = (char *)pSVar2;
      RangeStart._M_current = RangeStart._M_current + 1;
      __s = (ShaderCodeVariableDesc *)&__s->Class;
    } while (RangeStart._M_current != RangeEnd._M_current);
  }
  FixedLinearAllocator::~FixedLinearAllocator(&local_88);
  uVar4._M_t.super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  _M_t.super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar4._M_t.super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  _M_t.super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl.
  m_Allocator = (_Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>)
                (_Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>)this
  ;
  return (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>)
         uVar4._M_t.
         super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
         super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>;
}

Assistant:

static std::unique_ptr<void, STDDeleterRawMem<void>> PackArray(IterType RangeStart, IterType RangeEnd, IMemoryAllocator& RawAllocator)
    {
        FixedLinearAllocator Allocator{RawAllocator};

        const auto Size = RangeEnd - RangeStart;
        Allocator.AddSpace<ShaderCodeBufferDesc>(Size);
        for (auto Refl = RangeStart; Refl != RangeEnd; ++Refl)
            Refl->ReserveSpace(Allocator);

        Allocator.Reserve();
        std::unique_ptr<void, STDDeleterRawMem<void>> DataBuffer{Allocator.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

        auto* pRefl = Allocator.ConstructArray<ShaderCodeBufferDesc>(Size);
        VERIFY_EXPR(pRefl == DataBuffer.get());
        for (auto Refl = RangeStart; Refl != RangeEnd; ++Refl)
            *(pRefl++) = Refl->MakeCopy(Allocator);

        return DataBuffer;
    }